

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s.c
# Opt level: O0

int blake2s_done(hash_state *md,uchar *out)

{
  int iVar1;
  void *in_RSI;
  hash_state *in_RDI;
  ulong32 __t;
  unsigned_long i;
  uchar buffer [32];
  hash_state *in_stack_00000040;
  ulong local_40;
  undefined4 local_38 [8];
  void *local_18;
  hash_state *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_38,0,0x20);
  if (local_10 == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/blake2s.c",0x164)
    ;
  }
  if (local_18 == (void *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/blake2s.c",0x165)
    ;
  }
  iVar1 = blake2s_is_lastblock(local_10);
  if (iVar1 == 0) {
    blake2s_increment_counter(local_10,(ulong32)(local_10->sha3).s[0xd]);
    blake2s_set_lastblock((hash_state *)0x1ff1a2);
    memset((void *)((long)local_10 + (local_10->sha3).s[0xd] + 0x30),0,
           0x40 - (local_10->sha3).s[0xd]);
    blake2s_compress(in_stack_00000040,(uchar *)md->dummy);
    for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
      local_38[local_40] = *(undefined4 *)((long)local_10 + local_40 * 4);
    }
    memcpy(local_18,local_38,(local_10->sha3).s[0xe]);
    memset(local_10,0,0x1a0);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int blake2s_done(hash_state *md, unsigned char *out)
{
   unsigned char buffer[BLAKE2S_OUTBYTES] = { 0 };
   unsigned long i;

   LTC_ARGCHK(md != NULL);
   LTC_ARGCHK(out != NULL);

   /* if(md->blake2s.outlen != outlen) return CRYPT_INVALID_ARG; */

   if (blake2s_is_lastblock(md))
      return CRYPT_ERROR;

   blake2s_increment_counter(md, md->blake2s.curlen);
   blake2s_set_lastblock(md);
   XMEMSET(md->blake2s.buf + md->blake2s.curlen, 0, BLAKE2S_BLOCKBYTES - md->blake2s.curlen); /* Padding */
   blake2s_compress(md, md->blake2s.buf);

   for (i = 0; i < 8; ++i) /* Output full hash to temp buffer */
      STORE32L(md->blake2s.h[i], buffer + i * 4);

   XMEMCPY(out, buffer, md->blake2s.outlen);
   zeromem(md, sizeof(hash_state));
#ifdef LTC_CLEAN_STACK
   zeromem(buffer, sizeof(buffer));
#endif
   return CRYPT_OK;
}